

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqtable.cpp
# Opt level: O2

void __thiscall SQTable::_ClearNodes(SQTable *this)

{
  _HashNode *p_Var1;
  SQInteger i;
  long lVar2;
  long lVar3;
  
  lVar3 = 0x10;
  for (lVar2 = 0; lVar2 < this->_numofnodes; lVar2 = lVar2 + 1) {
    p_Var1 = this->_nodes;
    SQObjectPtr::Null((SQObjectPtr *)((long)&(p_Var1->val).super_SQObject._type + lVar3));
    SQObjectPtr::Null((SQObjectPtr *)((long)p_Var1 + lVar3 + -0x10));
    lVar3 = lVar3 + 0x28;
  }
  return;
}

Assistant:

void SQTable::_ClearNodes()
{
    for(SQInteger i = 0;i < _numofnodes; i++) { _HashNode &n = _nodes[i]; n.key.Null(); n.val.Null(); }
}